

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeBSTSStep3(octet *out,octet *in,void *state)

{
  long lVar1;
  bool_t bVar2;
  int iVar3;
  gen_i rng;
  gen_i mod;
  gen_i c;
  ec_o *ec;
  gen_i mod_00;
  gen_i dest;
  word wVar4;
  word *in_RDX;
  ec_o *in_RSI;
  word *in_RDI;
  void *stack;
  octet *block1;
  octet *block0;
  octet *K;
  word *sa;
  word *t;
  word *Va;
  size_t no;
  size_t n;
  bake_bsts_o *s;
  undefined7 in_stack_ffffffffffffff88;
  octet in_stack_ffffffffffffff8f;
  gen_i a;
  word *a_00;
  word *c_00;
  word *d;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  d = in_RDX;
  bVar2 = objIsOperable((void *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if (bVar2 != 0) {
    c_00 = *(word **)(*(long *)(in_RDX[3] + 0x18) + 0x30);
    a_00 = *(word **)(*(long *)(in_RDX[3] + 0x18) + 0x38);
    bVar2 = memIsValid(in_RSI,(long)a_00 << 1);
    if ((bVar2 != 0) && (bVar2 = memIsValid(in_RDI,(long)a_00 * 3 + in_RDX[0x3a] + 8), bVar2 != 0))
    {
      rng = (gen_i)((long)in_RDX + *in_RDX);
      mod = rng + (long)c_00 * 0x10;
      c = mod + ((ulong)c_00 >> 1) * 8 + 8;
      lVar1 = ((ulong)c_00 >> 1) * 8 + (long)c_00 * 8;
      ec = (ec_o *)(c + lVar1 + 8);
      mod_00 = c + lVar1 + 0x18;
      dest = c + lVar1 + 0x28;
      a = rng;
      iVar3 = (**(code **)(*(long *)(in_RDX[3] + 0x18) + 0x40))
                        (in_RDX[7],in_RSI,*(undefined8 *)(in_RDX[3] + 0x18),dest);
      if ((iVar3 == 0) ||
         ((iVar3 = (**(code **)(*(long *)(in_RDX[3] + 0x18) + 0x40))
                             (in_RDX[7] + (long)c_00 * 8,(long)&(in_RSI->hdr).keep + (long)a_00,
                              *(undefined8 *)(in_RDX[3] + 0x18),dest), iVar3 == 0 ||
          (bVar2 = ecpIsOnA((word *)rng,ec,mod_00), bVar2 == 0)))) {
        return 0x191;
      }
      bVar2 = zzRandNZMod((word *)a,(word *)mod,(size_t)c,rng,ec);
      if (bVar2 == 0) {
        return 0x130;
      }
      bVar2 = ecMulA((word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                     in_RSI,d,(size_t)in_RDX,c_00);
      if (bVar2 != 0) {
        (**(code **)(*(long *)(in_RDX[3] + 0x18) + 0x48))
                  (a,a,*(undefined8 *)(in_RDX[3] + 0x18),dest);
        (**(code **)(*(long *)(in_RDX[3] + 0x18) + 0x48))
                  (a + (long)a_00,a + (long)c_00 * 8,*(undefined8 *)(in_RDX[3] + 0x18),dest);
        beltHashStart(dest);
        beltHashStepH(ec,(size_t)mod_00,dest);
        beltHashStepH(ec,(size_t)mod_00,dest);
        beltHashStepG2((octet *)ec,(size_t)mod_00,dest);
        u64From((u64 *)dest,(void *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                0x12f1e2);
        memCopy(dest,(void *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),0x12f1f9)
        ;
        zzMul(c_00,a_00,(size_t)a,(word *)mod,(size_t)c,rng);
        wVar4 = zzAdd2((word *)(c + ((ulong)c_00 >> 1) * 8),(word *)in_RDX[4],(size_t)c_00);
        *(word *)(c + ((long)c_00 + ((ulong)c_00 >> 1)) * 8) = wVar4;
        zzMod(in_RDI,(word *)in_RSI,(size_t)d,in_RDX,(size_t)c_00,a_00);
        zzSubMod((word *)c,(word *)rng,(word *)ec,(word *)mod_00,(size_t)dest);
        u64To(dest,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),(u64 *)0x12f2e9);
        memCopy(dest,(void *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),0x12f314)
        ;
        bVar2 = ecMulA((word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       in_RSI,d,(size_t)in_RDX,c_00);
        if (bVar2 != 0) {
          (**(code **)(*(long *)(in_RDX[3] + 0x18) + 0x48))
                    (rng,a,*(undefined8 *)(in_RDX[3] + 0x18),dest);
          beltHashStart(dest);
          beltHashStepH(ec,(size_t)mod_00,dest);
          if (in_RDX[0x33] != 0) {
            beltHashStepH(ec,(size_t)mod_00,dest);
          }
          if (in_RDX[0x35] != 0) {
            beltHashStepH(ec,(size_t)mod_00,dest);
          }
          beltHashStepG((octet *)dest,
                        (void *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
          memSet(dest,in_stack_ffffffffffffff8f,0x12f424);
          memSet(dest,in_stack_ffffffffffffff8f,0x12f438);
          beltKRPStart(ec,(octet *)mod_00,(size_t)dest,
                       (octet *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
          beltKRPStepG((octet *)c,(size_t)rng,(octet *)ec,mod_00);
          *(undefined1 *)&(ec->hdr).keep = 1;
          beltKRPStepG((octet *)c,(size_t)rng,(octet *)ec,mod_00);
          *(undefined1 *)&(ec->hdr).keep = 2;
          beltKRPStepG((octet *)c,(size_t)rng,(octet *)ec,mod_00);
          *(undefined1 *)&(ec->hdr).keep = 0;
          beltCFBStart(ec,(octet *)mod_00,(size_t)dest,
                       (octet *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
          beltCFBStepE(ec,(size_t)mod_00,dest);
          beltMACStart(ec,(octet *)mod_00,(size_t)dest);
          beltMACStepA(ec,(size_t)mod_00,dest);
          beltMACStepA(ec,(size_t)mod_00,dest);
          beltMACStepG((octet *)dest,
                       (void *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
          wwCopy((word *)in_RDX[6],(word *)mod,(ulong)c_00 >> 1);
          *(undefined8 *)(in_RDX[6] + ((ulong)c_00 >> 1) * 8) = 1;
          return 0;
        }
        return 0x1f6;
      }
      return 0x1f6;
    }
  }
  return 0x6d;
}

Assistant:

err_t bakeBSTSStep3(octet out[], const octet in[], void* state)
{
	bake_bsts_o* s = (bake_bsts_o*)state;
	size_t n, no;
	// стек
	word* Va;			/* [2 * n] */
	word* t;			/* [n / 2 + 1] */
	word* sa;			/* [n + n / 2 + 1] */
	octet* K;			/* [no] (совпадает с Va) */
	octet* block0;		/* [16] (следует за sa) */
	octet* block1;		/* [16] (следует за block0) */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (!memIsValid(in, 2 * no) ||
		!memIsValid(out, 3 * no + s->cert->len + 8))
		return ERR_BAD_INPUT;
	ASSERT(memIsDisjoint2(out, 3 * no + s->cert->len + 8, s, objKeep(s)));
	// раскладка стека
	Va = objEnd(s, word);
	t = Va + 2 * n;
	sa = t + n / 2 + 1;
	K = (octet*)Va;
	block0 = (octet*)(sa + n + n / 2 + 1);
	block1 = block0 + 16;
	stack = block1 + 16;
	// Vb <- in, Vb \in E*?
	if (!qrFrom(ecX(s->Vb), in, s->ec->f, stack) ||
		!qrFrom(ecY(s->Vb, n), in + no, s->ec->f, stack) ||
		!ecpIsOnA(s->Vb, s->ec, stack))
		return ERR_BAD_POINT;
	// ua <-R {1, 2, ..., q - 1}
	if (!zzRandNZMod(s->u, s->ec->order, n, s->settings->rng,
		s->settings->rng_state))
		return ERR_BAD_RNG;
	// Va <- ua G
	if (!ecMulA(Va, s->ec->base, s->ec, s->u, n, stack))
		return ERR_BAD_PARAMS;
	qrTo((octet*)Va, ecX(Va), s->ec->f, stack);
	qrTo((octet*)Va + no, ecY(Va, n), s->ec->f, stack);
	// t <- <beltHash(<Va>_2l || <Vb>_2l)>_l
	beltHashStart(stack);
	beltHashStepH(Va, no, stack);
	beltHashStepH(in, no, stack);
	beltHashStepG2((octet*)t, no / 2, stack);
	wwFrom(t, t, no / 2);
	// out ||.. <- <Va>_4l
	memCopy(out, Va, 2 * no);
	// sa <- (ua - (2^l + t)da) \mod q
	zzMul(sa, t, n / 2, s->d, n, stack);
	sa[n + n / 2] = zzAdd2(sa + n / 2, s->d, n);
	zzMod(sa, sa, n + n / 2 + 1, s->ec->order, n, stack);
	zzSubMod(sa, s->u, sa, s->ec->order, n);
	// ..|| out ||.. <- sa || certa
	wwTo(out + 2 * no, no, sa);
	memCopy(out + 3 * no, s->cert->data, s->cert->len);
	// K <- beltHash(<ua Vb>_2l || helloa || hellob)
	if (!ecMulA(Va, s->Vb, s->ec, s->u, n, stack))
		return ERR_BAD_PARAMS;
	qrTo(K, ecX(Va), s->ec->f, stack);
	beltHashStart(stack);
	beltHashStepH(K, no, stack);
	if (s->settings->helloa)
		beltHashStepH(s->settings->helloa, s->settings->helloa_len, stack);
	if (s->settings->hellob)
		beltHashStepH(s->settings->hellob, s->settings->hellob_len, stack);
	beltHashStepG(K, stack);
	// K0 <- beltKRP(K, 1^96, 0)
	memSetZero(block0, 16);
	memSet(block1, 0xFF, 16);
	beltKRPStart(stack, K, 32, block1);
	beltKRPStepG(s->K0, 32, block0, stack);
	// K1 <- beltKRP(K, 1^96, 1)
	block0[0] = 1;
	beltKRPStepG(s->K1, 32, block0, stack);
	// K2 <- beltKRP(K, 1^96, 2)
	block0[0] = 2;
	beltKRPStepG(s->K2, 32, block0, stack);
	// ..|| out ||.. <- beltCFBEncr(sa || certa)
	block0[0] = 0;
	beltCFBStart(stack, s->K2, 32, block0);
	beltCFBStepE(out + 2 * no, no + s->cert->len, stack);
	// ..|| out <- beltMAC(beltCFBEncr(sa || certa) || 0^128)
	beltMACStart(stack, s->K1, 32);
	beltMACStepA(out + 2 * no, no + s->cert->len, stack);
	beltMACStepA(block0, 16, stack);
	beltMACStepG(out + 3 * no + s->cert->len, stack);
	// сохранить t
	wwCopy(s->t, t, n / 2);
	s->t[n / 2] = 1;
	// все нормально
	return ERR_OK;
}